

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O3

bool __thiscall
duckdb::LogicalDependencyEquality::operator()
          (LogicalDependencyEquality *this,LogicalDependency *a,LogicalDependency *b)

{
  size_t sVar1;
  int iVar2;
  
  if ((((((a->entry).type == (b->entry).type) &&
        (sVar1 = (a->entry).name._M_string_length, sVar1 == (b->entry).name._M_string_length)) &&
       ((sVar1 == 0 ||
        (iVar2 = bcmp((a->entry).name._M_dataplus._M_p,(b->entry).name._M_dataplus._M_p,sVar1),
        iVar2 == 0)))) &&
      (sVar1 = (a->entry).schema._M_string_length, sVar1 == (b->entry).schema._M_string_length)) &&
     (((sVar1 == 0 ||
       (iVar2 = bcmp((a->entry).schema._M_dataplus._M_p,(b->entry).schema._M_dataplus._M_p,sVar1),
       iVar2 == 0)) &&
      (sVar1 = (a->catalog)._M_string_length, sVar1 == (b->catalog)._M_string_length)))) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((a->catalog)._M_dataplus._M_p,(b->catalog)._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool LogicalDependencyEquality::operator()(const LogicalDependency &a, const LogicalDependency &b) const {
	if (a.entry.type != b.entry.type) {
		return false;
	}
	if (a.entry.name != b.entry.name) {
		return false;
	}
	if (a.entry.schema != b.entry.schema) {
		return false;
	}
	if (a.catalog != b.catalog) {
		return false;
	}
	return true;
}